

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.h
# Opt level: O1

void __thiscall board::Board::Board(Board *this)

{
  allocator<char> local_31;
  string local_30;
  
  (this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,DEFAULT_FEN,&local_31);
  parseFen(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Board()
    {
        parseFen(DEFAULT_FEN);
    }